

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

bool __thiscall helics::InputInfo::updateTimeNextIteration(InputInfo *this,Time newTime)

{
  bool bVar1;
  bool bVar2;
  iterator iVar3;
  pointer pdVar4;
  long in_RDI;
  bool res;
  uint cindex;
  iterator last;
  iterator it_final;
  iterator currentValue;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *data_queue;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
  *__range1;
  bool updated;
  int index;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
  *in_stack_ffffffffffffff68;
  reference in_stack_ffffffffffffff70;
  bool local_81;
  iterator in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffffac;
  __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
  update;
  __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
  local_40;
  reference local_38;
  vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *local_30;
  __normal_iterator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
  local_28;
  long local_20;
  byte local_15;
  int local_14;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_14 = 0;
  local_15 = 0;
  local_20 = in_RDI + 0x110;
  local_28._M_current =
       (vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_> *)
       std::
       vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
       ::begin((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                *)in_stack_ffffffffffffff68);
  local_30 = (vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
              *)std::
                vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                ::end((vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                       *)in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::
                 operator==<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                           ((__normal_iterator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
                             *)in_stack_ffffffffffffff68), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
               ::operator*(&local_28);
    local_40._M_current =
         (dataRecord *)
         std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
         ::begin(in_stack_ffffffffffffff68);
    iVar3 = std::
            vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
            end(in_stack_ffffffffffffff68);
    bVar1 = __gnu_cxx::
            operator==<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                      ((__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                        *)in_stack_ffffffffffffff70,
                       (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                        *)in_stack_ffffffffffffff68);
    if (bVar1) {
      local_14 = local_14 + 1;
    }
    else {
      pdVar4 = __gnu_cxx::
               __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
               ::operator->(&local_40);
      bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>(&pdVar4->time,&local_8);
      if (bVar1) {
        local_14 = local_14 + 1;
      }
      else {
        update._M_current = local_40._M_current;
        __gnu_cxx::
        __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
        ::operator++(&local_40);
        while( true ) {
          bVar1 = __gnu_cxx::
                  operator==<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                            ((__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                              *)in_stack_ffffffffffffff70,
                             (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                              *)in_stack_ffffffffffffff68);
          local_81 = false;
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            pdVar4 = __gnu_cxx::
                     __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                     ::operator->(&local_40);
            local_81 = TimeRepresentation<count_time<9,_long>_>::operator<(&pdVar4->time,&local_8);
          }
          if (local_81 == false) break;
          update._M_current = local_40._M_current;
          __gnu_cxx::
          __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
          ::operator++(&local_40);
        }
        bVar1 = __gnu_cxx::
                operator==<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                          ((__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                            *)in_stack_ffffffffffffff70,
                           (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                            *)in_stack_ffffffffffffff68);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          pdVar4 = __gnu_cxx::
                   __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                   ::operator->(&local_40);
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==(&pdVar4->time,&local_8);
          if (bVar1) {
            pdVar4 = __gnu_cxx::
                     __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                     ::operator->((__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                                   *)&stack0xffffffffffffffb0);
            in_stack_ffffffffffffffac = pdVar4->iteration;
            while( true ) {
              bVar2 = __gnu_cxx::
                      operator==<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                                ((__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                                  *)in_stack_ffffffffffffff70,
                                 (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                                  *)in_stack_ffffffffffffff68);
              bVar1 = false;
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                pdVar4 = __gnu_cxx::
                         __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                         ::operator->(&local_40);
                bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==(&pdVar4->time,&local_8)
                ;
                bVar1 = false;
                if (bVar2) {
                  pdVar4 = __gnu_cxx::
                           __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                           ::operator->(&local_40);
                  bVar1 = pdVar4->iteration == in_stack_ffffffffffffffac;
                }
              }
              if (!bVar1) break;
              update._M_current = local_40._M_current;
              __gnu_cxx::
              __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
              ::operator++(&local_40);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
        ::operator*((__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                     *)&stack0xffffffffffffffb0);
        bVar1 = updateData((InputInfo *)iVar3._M_current,update._M_current,in_stack_ffffffffffffffac
                          );
        in_stack_ffffffffffffff70 = local_38;
        iVar3 = std::
                vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                ::begin(in_stack_ffffffffffffff68);
        __gnu_cxx::
        __normal_iterator<helics::InputInfo::dataRecord_const*,std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>>
        ::__normal_iterator<helics::InputInfo::dataRecord*>
                  ((__normal_iterator<const_helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                    *)in_stack_ffffffffffffff70,
                   (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                    *)in_stack_ffffffffffffff68);
        __gnu_cxx::
        __normal_iterator<helics::InputInfo::dataRecord_const*,std::vector<helics::InputInfo::dataRecord,std::allocator<helics::InputInfo::dataRecord>>>
        ::__normal_iterator<helics::InputInfo::dataRecord*>
                  ((__normal_iterator<const_helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                    *)in_stack_ffffffffffffff70,
                   (__normal_iterator<helics::InputInfo::dataRecord_*,_std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>
                    *)in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff88 =
             std::
             vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
             erase(in_stack_ffffffffffffff88._M_current,iVar3._M_current,in_stack_ffffffffffffff90);
        local_14 = local_14 + 1;
        if (bVar1) {
          local_15 = 1;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_*,_std::vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>_>
    ::operator++(&local_28);
  }
  return (bool)(local_15 & 1);
}

Assistant:

bool InputInfo::updateTimeNextIteration(Time newTime)
{
    int index{0};
    bool updated{false};
    for (auto& data_queue : data_queues) {
        auto currentValue = data_queue.begin();
        auto it_final = data_queue.end();
        if (currentValue == it_final) {
            ++index;
            continue;
        }
        if (currentValue->time > newTime) {
            ++index;
            continue;
        }
        auto last = currentValue;
        ++currentValue;
        while ((currentValue != it_final) && (currentValue->time < newTime)) {
            last = currentValue;
            ++currentValue;
        }
        if (currentValue != it_final) {
            if (currentValue->time == newTime) {
                auto cindex = last->iteration;
                while ((currentValue != it_final) && (currentValue->time == newTime) &&
                       (currentValue->iteration == cindex)) {
                    last = currentValue;
                    ++currentValue;
                }
            }
        }

        auto res = updateData(std::move(*last), index);
        data_queue.erase(data_queue.begin(), currentValue);
        ++index;
        if (res) {
            updated = true;
        }
    }
    return updated;
}